

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u32 XXH32_endian_align(xxh_u8 *input,size_t len,xxh_u32 seed,XXH_alignment align)

{
  xxh_u32 xVar1;
  xxh_u32 local_48;
  xxh_u32 local_44;
  xxh_u32 v4;
  xxh_u32 v3;
  xxh_u32 v2;
  xxh_u32 v1;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u32 h32;
  XXH_alignment align_local;
  xxh_u32 seed_local;
  size_t len_local;
  xxh_u8 *input_local;
  
  len_local = (size_t)input;
  if (len < 0x10) {
    bEnd._4_4_ = seed + 0x165667b1;
  }
  else {
    v3 = seed + 0x24234428;
    v4 = seed + 0x85ebca77;
    local_48 = seed + 0x61c8864f;
    local_44 = seed;
    do {
      xVar1 = XXH_readLE32_align((void *)len_local,align);
      v3 = XXH32_round(v3,xVar1);
      xVar1 = XXH_readLE32_align((void *)(len_local + 4),align);
      v4 = XXH32_round(v4,xVar1);
      xVar1 = XXH_readLE32_align((void *)(len_local + 8),align);
      local_44 = XXH32_round(local_44,xVar1);
      xVar1 = XXH_readLE32_align((void *)(len_local + 0xc),align);
      local_48 = XXH32_round(local_48,xVar1);
      len_local = len_local + 0x10;
    } while (len_local < input + (len - 0xf));
    bEnd._4_4_ = (v3 << 1 | (uint)((int)v3 < 0)) + (v4 << 7 | v4 >> 0x19) +
                 (local_44 << 0xc | local_44 >> 0x14) + (local_48 << 0x12 | local_48 >> 0xe);
  }
  xVar1 = XXH32_finalize((int)len + bEnd._4_4_,(xxh_u8 *)len_local,len & 0xf,align);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE xxh_u32
XXH32_endian_align(const xxh_u8* input, size_t len, xxh_u32 seed, XXH_alignment align)
{
    xxh_u32 h32;

    if (input==NULL) XXH_ASSERT(len == 0);

    if (len>=16) {
        const xxh_u8* const bEnd = input + len;
        const xxh_u8* const limit = bEnd - 15;
        xxh_u32 v1 = seed + XXH_PRIME32_1 + XXH_PRIME32_2;
        xxh_u32 v2 = seed + XXH_PRIME32_2;
        xxh_u32 v3 = seed + 0;
        xxh_u32 v4 = seed - XXH_PRIME32_1;

        do {
            v1 = XXH32_round(v1, XXH_get32bits(input)); input += 4;
            v2 = XXH32_round(v2, XXH_get32bits(input)); input += 4;
            v3 = XXH32_round(v3, XXH_get32bits(input)); input += 4;
            v4 = XXH32_round(v4, XXH_get32bits(input)); input += 4;
        } while (input < limit);

        h32 = XXH_rotl32(v1, 1)  + XXH_rotl32(v2, 7)
            + XXH_rotl32(v3, 12) + XXH_rotl32(v4, 18);
    } else {
        h32  = seed + XXH_PRIME32_5;
    }

    h32 += (xxh_u32)len;

    return XXH32_finalize(h32, input, len&15, align);
}